

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::sse2::BVH4QuantizedQuad4vSceneBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_> *this;
  
  this = (BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_> *)::operator_new(0xa0);
  BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_>::BVHNBuilderSAHQuantized
            (this,(BVH *)bvh,scene,4,1.0,4,0xffffffffffffffff,MTY_QUAD_MESH);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4QuantizedQuad4vSceneBuilderSAH     (void* bvh, Scene* scene, size_t mode) { return new BVHNBuilderSAHQuantized<4,Quad4v>((BVH4*)bvh,scene,4,1.0f,4,inf,QuadMesh::geom_type); }